

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprintpreviewdialog.cpp
# Opt level: O2

void QPrintPreviewDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c != IndexOfMethod) {
      if (_c == InvokeMetaMethod) {
        switch(_id) {
        case 0:
          paintRequested((QPrintPreviewDialog *)_o,*_a[1]);
          return;
        case 1:
          QPrintPreviewDialogPrivate::_q_fit(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
          return;
        case 2:
          QPrintPreviewDialogPrivate::_q_zoomIn(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 3:
          QPrintPreviewDialogPrivate::_q_zoomOut(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 4:
          QPrintPreviewDialogPrivate::_q_navigate(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
          return;
        case 5:
          QPrintPreviewDialogPrivate::_q_setMode(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
          return;
        case 6:
          QPrintPreviewDialogPrivate::_q_pageNumEdited(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 7:
          QPrintPreviewDialogPrivate::_q_print(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 8:
          QPrintPreviewDialogPrivate::_q_pageSetup(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 9:
          QPrintPreviewDialogPrivate::_q_previewChanged(*(QPrintPreviewDialogPrivate **)(_o + 8));
          return;
        case 10:
          QPrintPreviewDialogPrivate::_q_zoomFactorChanged(*(QPrintPreviewDialogPrivate **)(_o + 8))
          ;
          return;
        }
      }
      return;
    }
    QtMocHelpers::indexOfMethod<void(QPrintPreviewDialog::*)(QPrinter*)>
              ((QtMocHelpers *)_a,(void **)paintRequested,0,0);
    return;
  }
  if (((_id == 1) || (_id == 4)) || (_id == 5)) {
    puVar1 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
      return;
    }
  }
  else {
    puVar1 = (undefined8 *)*_a;
  }
  *puVar1 = 0;
  return;
}

Assistant:

void QPrintPreviewDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPrintPreviewDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->paintRequested((*reinterpret_cast< std::add_pointer_t<QPrinter*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_fit((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 2: _t->d_func()->_q_zoomIn(); break;
        case 3: _t->d_func()->_q_zoomOut(); break;
        case 4: _t->d_func()->_q_navigate((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 5: _t->d_func()->_q_setMode((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 6: _t->d_func()->_q_pageNumEdited(); break;
        case 7: _t->d_func()->_q_print(); break;
        case 8: _t->d_func()->_q_pageSetup(); break;
        case 9: _t->d_func()->_q_previewChanged(); break;
        case 10: _t->d_func()->_q_zoomFactorChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPrintPreviewDialog::*)(QPrinter * )>(_a, &QPrintPreviewDialog::paintRequested, 0))
            return;
    }
}